

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.h
# Opt level: O1

void __thiscall
TPZFront<float>::STensorProductMTData::STensorProductMTData
          (STensorProductMTData *this,int nthreads,TPZFront<float> *frontMat)

{
  ulong uVar1;
  STensorProductThreadData *threadData;
  thread local_50;
  undefined **local_48;
  condition_variable *local_40;
  pair<int,_TPZFront<float>::STensorProductMTData_*> *local_38;
  
  (this->fWorkDoneSem).fCounter = 0;
  (this->fWorkDoneSem).fMutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->fWorkDoneSem).fMutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->fWorkDoneSem).fMutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->fWorkDoneSem).fMutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->fWorkDoneSem).fMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_40 = &(this->fWorkDoneSem).fCond;
  std::condition_variable::condition_variable(local_40);
  (this->fMutexWorkDoneCS).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->fMutexWorkDoneCS).super___mutex_base._M_mutex + 0x10) = 0;
  (this->fMutexWorkDoneCS).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->fMutexWorkDoneCS).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->fMutexWorkDoneCS).super___mutex_base._M_mutex + 8) = 0;
  (this->fWorkSem)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_019a7500;
  (this->fWorkSem).fStore = (TPZSemaphore *)0x0;
  (this->fWorkSem).fNElements = 0;
  (this->fWorkSem).fNAlloc = 0;
  (this->fThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = &PTR__TPZVec_019a7550;
  (this->fThreadData)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_019a7550;
  (this->fThreadData).fStore = (pair<int,_TPZFront<float>::STensorProductMTData_*> **)0x0;
  (this->fThreadData).fNElements = 0;
  (this->fThreadData).fNAlloc = 0;
  if (frontMat == (TPZFront<float> *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/TPZFront.h"
               ,0xd9);
  }
  this->fMat = frontMat;
  this->fRunning = true;
  TPZVec<TPZSemaphore>::Resize(&this->fWorkSem,(long)nthreads);
  TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*>::Resize
            (&this->fThreadData,(long)nthreads);
  if (0 < nthreads) {
    uVar1 = 0;
    do {
      local_38 = (pair<int,_TPZFront<float>::STensorProductMTData_*> *)operator_new(0x10);
      local_38->first = 0;
      local_38->second = (STensorProductMTData *)0x0;
      local_38->first = (int)uVar1;
      local_38->second = this;
      (this->fThreadData).fStore[uVar1] = local_38;
      std::thread::
      thread<void*(&)(void*),std::pair<int,TPZFront<float>::STensorProductMTData*>*&,void>
                (&local_50,Execute,&local_38);
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&this->fThreads,&local_50);
      if (local_50._M_id._M_thread != 0) {
        std::terminate();
      }
      uVar1 = uVar1 + 1;
    } while ((uint)nthreads != uVar1);
  }
  return;
}

Assistant:

STensorProductMTData(int nthreads, TPZFront<TVar> * frontMat){
			if(!frontMat) DebugStop();
			this->fMat = frontMat;
			this->fRunning = true;
			
			fWorkSem.Resize(nthreads);
			
      // threads must be initialised already with thread work
			// fThreads.resize(nthreads);
			fThreadData.Resize(nthreads);
			for(int i = 0; i < nthreads; i++){
				STensorProductThreadData * threadData = new STensorProductThreadData;
				threadData->first = i;
				threadData->second = this;
				fThreadData[i] = threadData;
        fThreads.push_back(std::thread(Execute, threadData));
			}
		}